

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

void aom_hadamard_lp_16x16_sse2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  short *psVar4;
  uint uVar5;
  int16_t *piVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar5 = 0;
  piVar6 = coeff;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 4) {
    hadamard_lp_8x8_sse2
              (src_diff + (ulong)((uint)lVar7 & 8) * src_stride + (ulong)(uVar5 & 8),src_stride,
               piVar6);
    piVar6 = piVar6 + 0x40;
    uVar5 = uVar5 + 8;
  }
  for (lVar7 = 0; (uint)lVar7 < 0x40; lVar7 = lVar7 + 8) {
    psVar1 = coeff + lVar7;
    psVar2 = coeff + lVar7 + 0x40;
    psVar3 = coeff + lVar7 + 0x80;
    psVar4 = coeff + lVar7 + 0xc0;
    auVar11._0_2_ = *psVar2 + *psVar1;
    auVar11._2_2_ = psVar2[1] + psVar1[1];
    auVar11._4_2_ = psVar2[2] + psVar1[2];
    auVar11._6_2_ = psVar2[3] + psVar1[3];
    auVar11._8_2_ = psVar2[4] + psVar1[4];
    auVar11._10_2_ = psVar2[5] + psVar1[5];
    auVar11._12_2_ = psVar2[6] + psVar1[6];
    auVar11._14_2_ = psVar2[7] + psVar1[7];
    auVar8._0_2_ = *psVar1 - *psVar2;
    auVar8._2_2_ = psVar1[1] - psVar2[1];
    auVar8._4_2_ = psVar1[2] - psVar2[2];
    auVar8._6_2_ = psVar1[3] - psVar2[3];
    auVar8._8_2_ = psVar1[4] - psVar2[4];
    auVar8._10_2_ = psVar1[5] - psVar2[5];
    auVar8._12_2_ = psVar1[6] - psVar2[6];
    auVar8._14_2_ = psVar1[7] - psVar2[7];
    auVar9._0_2_ = *psVar4 + *psVar3;
    auVar9._2_2_ = psVar4[1] + psVar3[1];
    auVar9._4_2_ = psVar4[2] + psVar3[2];
    auVar9._6_2_ = psVar4[3] + psVar3[3];
    auVar9._8_2_ = psVar4[4] + psVar3[4];
    auVar9._10_2_ = psVar4[5] + psVar3[5];
    auVar9._12_2_ = psVar4[6] + psVar3[6];
    auVar9._14_2_ = psVar4[7] + psVar3[7];
    auVar10._0_2_ = *psVar3 - *psVar4;
    auVar10._2_2_ = psVar3[1] - psVar4[1];
    auVar10._4_2_ = psVar3[2] - psVar4[2];
    auVar10._6_2_ = psVar3[3] - psVar4[3];
    auVar10._8_2_ = psVar3[4] - psVar4[4];
    auVar10._10_2_ = psVar3[5] - psVar4[5];
    auVar10._12_2_ = psVar3[6] - psVar4[6];
    auVar10._14_2_ = psVar3[7] - psVar4[7];
    auVar11 = psraw(auVar11,1);
    auVar8 = psraw(auVar8,1);
    auVar9 = psraw(auVar9,1);
    auVar10 = psraw(auVar10,1);
    piVar6 = coeff + lVar7;
    *piVar6 = auVar9._0_2_ + auVar11._0_2_;
    piVar6[1] = auVar9._2_2_ + auVar11._2_2_;
    piVar6[2] = auVar9._4_2_ + auVar11._4_2_;
    piVar6[3] = auVar9._6_2_ + auVar11._6_2_;
    piVar6[4] = auVar9._8_2_ + auVar11._8_2_;
    piVar6[5] = auVar9._10_2_ + auVar11._10_2_;
    piVar6[6] = auVar9._12_2_ + auVar11._12_2_;
    piVar6[7] = auVar9._14_2_ + auVar11._14_2_;
    piVar6 = coeff + lVar7 + 0x40;
    *piVar6 = auVar10._0_2_ + auVar8._0_2_;
    piVar6[1] = auVar10._2_2_ + auVar8._2_2_;
    piVar6[2] = auVar10._4_2_ + auVar8._4_2_;
    piVar6[3] = auVar10._6_2_ + auVar8._6_2_;
    piVar6[4] = auVar10._8_2_ + auVar8._8_2_;
    piVar6[5] = auVar10._10_2_ + auVar8._10_2_;
    piVar6[6] = auVar10._12_2_ + auVar8._12_2_;
    piVar6[7] = auVar10._14_2_ + auVar8._14_2_;
    piVar6 = coeff + lVar7 + 0x80;
    *piVar6 = auVar11._0_2_ - auVar9._0_2_;
    piVar6[1] = auVar11._2_2_ - auVar9._2_2_;
    piVar6[2] = auVar11._4_2_ - auVar9._4_2_;
    piVar6[3] = auVar11._6_2_ - auVar9._6_2_;
    piVar6[4] = auVar11._8_2_ - auVar9._8_2_;
    piVar6[5] = auVar11._10_2_ - auVar9._10_2_;
    piVar6[6] = auVar11._12_2_ - auVar9._12_2_;
    piVar6[7] = auVar11._14_2_ - auVar9._14_2_;
    piVar6 = coeff + lVar7 + 0xc0;
    *piVar6 = auVar8._0_2_ - auVar10._0_2_;
    piVar6[1] = auVar8._2_2_ - auVar10._2_2_;
    piVar6[2] = auVar8._4_2_ - auVar10._4_2_;
    piVar6[3] = auVar8._6_2_ - auVar10._6_2_;
    piVar6[4] = auVar8._8_2_ - auVar10._8_2_;
    piVar6[5] = auVar8._10_2_ - auVar10._10_2_;
    piVar6[6] = auVar8._12_2_ - auVar10._12_2_;
    piVar6[7] = auVar8._14_2_ - auVar10._14_2_;
  }
  return;
}

Assistant:

void aom_hadamard_lp_16x16_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                                int16_t *coeff) {
  for (int idx = 0; idx < 4; ++idx) {
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    hadamard_lp_8x8_sse2(src_ptr, src_stride, coeff + idx * 64);
  }

  int16_t *t_coeff = coeff;
  for (int idx = 0; idx < 64; idx += 8) {
    __m128i coeff0 = _mm_load_si128((const __m128i *)t_coeff);
    __m128i coeff1 = _mm_load_si128((const __m128i *)(t_coeff + 64));
    __m128i coeff2 = _mm_load_si128((const __m128i *)(t_coeff + 128));
    __m128i coeff3 = _mm_load_si128((const __m128i *)(t_coeff + 192));

    __m128i b0 = _mm_add_epi16(coeff0, coeff1);
    __m128i b1 = _mm_sub_epi16(coeff0, coeff1);
    __m128i b2 = _mm_add_epi16(coeff2, coeff3);
    __m128i b3 = _mm_sub_epi16(coeff2, coeff3);

    b0 = _mm_srai_epi16(b0, 1);
    b1 = _mm_srai_epi16(b1, 1);
    b2 = _mm_srai_epi16(b2, 1);
    b3 = _mm_srai_epi16(b3, 1);

    coeff0 = _mm_add_epi16(b0, b2);
    coeff1 = _mm_add_epi16(b1, b3);
    coeff2 = _mm_sub_epi16(b0, b2);
    coeff3 = _mm_sub_epi16(b1, b3);

    _mm_store_si128((__m128i *)t_coeff, coeff0);
    _mm_store_si128((__m128i *)(t_coeff + 64), coeff1);
    _mm_store_si128((__m128i *)(t_coeff + 128), coeff2);
    _mm_store_si128((__m128i *)(t_coeff + 192), coeff3);

    t_coeff += 8;
  }
}